

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_13::NameResolver::VisitModule(NameResolver *this,Module *module)

{
  bool bVar1;
  reference ppFVar2;
  reference ppEVar3;
  reference ppGVar4;
  reference ppEVar5;
  reference ppDVar6;
  reference ppVVar7;
  Var *start;
  iterator __end1_5;
  iterator __begin1_5;
  vector<wabt::Var_*,_std::allocator<wabt::Var_*>_> *__range1_5;
  DataSegment *data_segment;
  iterator __end1_4;
  iterator __begin1_4;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *__range1_4;
  ElemSegment *elem_segment;
  iterator __end1_3;
  iterator __begin1_3;
  vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_> *__range1_3;
  Global *global;
  iterator __end1_2;
  iterator __begin1_2;
  vector<wabt::Global_*,_std::allocator<wabt::Global_*>_> *__range1_2;
  Export *export_;
  iterator __end1_1;
  iterator __begin1_1;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *__range1_1;
  Func *func;
  iterator __end1;
  iterator __begin1;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *__range1;
  Module *module_local;
  NameResolver *this_local;
  
  this->current_module_ = module;
  CheckDuplicateBindings(this,&module->func_bindings,"function");
  CheckDuplicateBindings(this,&module->global_bindings,"global");
  CheckDuplicateBindings(this,&module->func_type_bindings,"function type");
  CheckDuplicateBindings(this,&module->table_bindings,"table");
  CheckDuplicateBindings(this,&module->memory_bindings,"memory");
  CheckDuplicateBindings(this,&module->except_bindings,"except");
  __end1 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::begin(&module->funcs);
  func = (Func *)std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::end(&module->funcs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wabt::Func_**,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
                                *)&func);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<wabt::Func_**,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
              ::operator*(&__end1);
    VisitFunc(this,*ppFVar2);
    __gnu_cxx::
    __normal_iterator<wabt::Func_**,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::begin(&module->exports);
  export_ = (Export *)
            std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::end(&module->exports);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<wabt::Export_**,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                        *)&export_);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<wabt::Export_**,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
              ::operator*(&__end1_1);
    VisitExport(this,*ppEVar3);
    __gnu_cxx::
    __normal_iterator<wabt::Export_**,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::begin(&module->globals);
  global = (Global *)
           std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::end(&module->globals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<wabt::Global_**,_std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>_>
                        *)&global);
    if (!bVar1) break;
    ppGVar4 = __gnu_cxx::
              __normal_iterator<wabt::Global_**,_std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>_>
              ::operator*(&__end1_2);
    VisitGlobal(this,*ppGVar4);
    __gnu_cxx::
    __normal_iterator<wabt::Global_**,_std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::begin
                       (&module->elem_segments);
  elem_segment = (ElemSegment *)
                 std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::end
                           (&module->elem_segments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<wabt::ElemSegment_**,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
                        *)&elem_segment);
    if (!bVar1) break;
    ppEVar5 = __gnu_cxx::
              __normal_iterator<wabt::ElemSegment_**,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
              ::operator*(&__end1_3);
    VisitElemSegment(this,*ppEVar5);
    __gnu_cxx::
    __normal_iterator<wabt::ElemSegment_**,_std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>_>
    ::operator++(&__end1_3);
  }
  __end1_4 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::begin
                       (&module->data_segments);
  data_segment = (DataSegment *)
                 std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::end
                           (&module->data_segments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_4,
                       (__normal_iterator<wabt::DataSegment_**,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
                        *)&data_segment);
    if (!bVar1) break;
    ppDVar6 = __gnu_cxx::
              __normal_iterator<wabt::DataSegment_**,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
              ::operator*(&__end1_4);
    VisitDataSegment(this,*ppDVar6);
    __gnu_cxx::
    __normal_iterator<wabt::DataSegment_**,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
    ::operator++(&__end1_4);
  }
  __end1_5 = std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>::begin(&module->starts);
  start = (Var *)std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>::end(&module->starts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_5,
                       (__normal_iterator<wabt::Var_**,_std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>_>
                        *)&start);
    if (!bVar1) break;
    ppVVar7 = __gnu_cxx::
              __normal_iterator<wabt::Var_**,_std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>_>
              ::operator*(&__end1_5);
    ResolveFuncVar(this,*ppVVar7);
    __gnu_cxx::
    __normal_iterator<wabt::Var_**,_std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>_>::
    operator++(&__end1_5);
  }
  this->current_module_ = (Module *)0x0;
  return (Result)(this->result_).enum_;
}

Assistant:

Result NameResolver::VisitModule(Module* module) {
  current_module_ = module;
  CheckDuplicateBindings(&module->func_bindings, "function");
  CheckDuplicateBindings(&module->global_bindings, "global");
  CheckDuplicateBindings(&module->func_type_bindings, "function type");
  CheckDuplicateBindings(&module->table_bindings, "table");
  CheckDuplicateBindings(&module->memory_bindings, "memory");
  CheckDuplicateBindings(&module->except_bindings, "except");

  for (Func* func : module->funcs)
    VisitFunc(func);
  for (Export* export_ : module->exports)
    VisitExport(export_);
  for (Global* global : module->globals)
    VisitGlobal(global);
  for (ElemSegment* elem_segment : module->elem_segments)
    VisitElemSegment(elem_segment);
  for (DataSegment* data_segment : module->data_segments)
    VisitDataSegment(data_segment);
  for (Var* start : module->starts)
    ResolveFuncVar(start);
  current_module_ = nullptr;
  return result_;
}